

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# status.cc
# Opt level: O2

string * __thiscall
google::protobuf::util::Status::ToString_abi_cxx11_(string *__return_storage_ptr__,Status *this)

{
  Code CVar1;
  Code in_EDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_58;
  string local_38;
  
  CVar1 = this->error_code_;
  if (CVar1 == OK) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)__return_storage_ptr__,"OK",(allocator<char> *)&bStack_58);
  }
  else if ((this->error_message_)._M_string_length == 0) {
    error::CodeEnumToString_abi_cxx11_(__return_storage_ptr__,(error *)(ulong)CVar1,in_EDX);
  }
  else {
    error::CodeEnumToString_abi_cxx11_(&local_38,(error *)(ulong)CVar1,in_EDX);
    std::operator+(&bStack_58,&local_38,":");
    std::operator+(__return_storage_ptr__,&bStack_58,&this->error_message_);
    std::__cxx11::string::~string((string *)&bStack_58);
    std::__cxx11::string::~string((string *)&local_38);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string Status::ToString() const {
  if (error_code_ == error::OK) {
    return "OK";
  } else {
    if (error_message_.empty()) {
      return error::CodeEnumToString(error_code_);
    } else {
      return error::CodeEnumToString(error_code_) + ":" +
          error_message_;
    }
  }
}